

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38e3a9::SizeofParamPackExpr::printLeft(SizeofParamPackExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  ParameterPackExpansion local_28;
  
  R.Last = "";
  R.First = "sizeof...(";
  OutputStream::operator+=(S,R);
  local_28.Child = this->Pack;
  local_28.super_Node.K = KParameterPackExpansion;
  local_28.super_Node.RHSComponentCache = No;
  local_28.super_Node.ArrayCache = No;
  local_28.super_Node.FunctionCache = No;
  local_28.super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001f7a98;
  ParameterPackExpansion::printLeft(&local_28,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "sizeof...(";
    ParameterPackExpansion PPE(Pack);
    PPE.printLeft(S);
    S += ")";
  }